

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments *app)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (0 < ShowExampleAppDocuments(bool*)::app) {
    lVar2 = 9;
    lVar3 = 0;
    do {
      lVar1 = DAT_00278278;
      if ((*(char *)(DAT_00278278 + -1 + lVar2) == '\0') &&
         (*(char *)(DAT_00278278 + lVar2) == '\x01')) {
        ImGui::SetTabItemClosed(*(char **)(DAT_00278278 + -9 + lVar2));
      }
      *(undefined1 *)(lVar1 + lVar2) = *(undefined1 *)(lVar1 + -1 + lVar2);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar3 < ShowExampleAppDocuments(bool*)::app);
  }
  return;
}

Assistant:

static void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments& app)
{
    for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
    {
        MyDocument* doc = &app.Documents[doc_n];
        if (!doc->Open && doc->OpenPrev)
            ImGui::SetTabItemClosed(doc->Name);
        doc->OpenPrev = doc->Open;
    }
}